

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  bool local_e9;
  undefined1 local_e8 [7];
  bool use_dirX;
  string dirX;
  bool use_dir;
  size_type libX_pos;
  byte local_91;
  undefined1 local_90 [7];
  bool use_libX;
  string libX;
  undefined1 local_58 [7];
  bool use_lib;
  string lib;
  size_type pos;
  bool fresh_local;
  char *suffix_local;
  size_type start_pos_local;
  string *dir_local;
  cmFindLibraryCommand *this_local;
  
  lib.field_2._8_8_ = std::__cxx11::string::find((char *)dir,0xa54346);
  if (lib.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)dir);
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   suffix);
    local_91 = cmsys::SystemTools::FileIsDirectory((string *)local_90);
    if ((((bool)local_91) && (bVar2)) &&
       (bVar3 = cmLibDirsLinked((string *)local_90,(string *)local_58), bVar3)) {
      local_91 = 0;
    }
    if ((local_91 & 1) != 0) {
      std::__cxx11::string::substr((ulong)&libX_pos,(ulong)dir);
      std::__cxx11::string::operator+=((string *)local_90,(string *)&libX_pos);
      std::__cxx11::string::~string((string *)&libX_pos);
      uVar1 = lib.field_2._8_8_;
      sVar4 = strlen(suffix);
      AddArchitecturePath(this,(string *)local_90,uVar1 + 4 + sVar4,suffix,true);
    }
    if (bVar2) {
      AddArchitecturePath(this,dir,lib.field_2._8_8_ + 4,suffix,false);
    }
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_58);
  }
  if (fresh) {
    dirX.field_2._M_local_buf[0xf] = cmsys::SystemTools::FileIsDirectory(dir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,dir
                   ,suffix);
    local_e9 = cmsys::SystemTools::FileIsDirectory
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8);
    if (((local_e9) && ((dirX.field_2._M_local_buf[0xf] & 1U) != 0)) &&
       (bVar2 = cmLibDirsLinked((string *)local_e8,dir), bVar2)) {
      local_e9 = false;
    }
    if (local_e9 != false) {
      std::__cxx11::string::operator+=((string *)local_e8,"/");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,(value_type *)local_e8);
    }
    if ((dirX.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
    }
    std::__cxx11::string::~string((string *)local_e8);
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos, const char* suffix,
  bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);

  if (pos != std::string::npos) {
    // Check for "lib".
    std::string lib = dir.substr(0, pos + 3);
    bool use_lib = cmSystemTools::FileIsDirectory(lib);

    // Check for "lib<suffix>" and use it first.
    std::string libX = lib + suffix;
    bool use_libX = cmSystemTools::FileIsDirectory(libX);

    // Avoid copies of the same directory due to symlinks.
    if (use_libX && use_lib && cmLibDirsLinked(libX, lib)) {
      use_libX = false;
    }

    if (use_libX) {
      libX += dir.substr(pos + 3);
      std::string::size_type libX_pos = pos + 3 + strlen(suffix) + 1;
      this->AddArchitecturePath(libX, libX_pos, suffix);
    }

    if (use_lib) {
      this->AddArchitecturePath(dir, pos + 3 + 1, suffix, false);
    }
  }

  if (fresh) {
    // Check for the original unchanged path.
    bool use_dir = cmSystemTools::FileIsDirectory(dir);

    // Check for <dir><suffix>/ and use it first.
    std::string dirX = dir + suffix;
    bool use_dirX = cmSystemTools::FileIsDirectory(dirX);

    // Avoid copies of the same directory due to symlinks.
    if (use_dirX && use_dir && cmLibDirsLinked(dirX, dir)) {
      use_dirX = false;
    }

    if (use_dirX) {
      dirX += "/";
      this->SearchPaths.push_back(dirX);
    }

    if (use_dir) {
      this->SearchPaths.push_back(dir);
    }
  }
}